

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackingTokenStream
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this)

{
  StreamBlock *this_00;
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this_local;
  
  TokenStream<SGParser::Generator::RegExprParseToken>::TokenStream
            (&this->super_TokenStream<SGParser::Generator::RegExprParseToken>);
  (this->super_TokenStream<SGParser::Generator::RegExprParseToken>)._vptr_TokenStream =
       (_func_int **)&PTR__BacktrackingTokenStream_001edd10;
  this->pSourceStream = (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0;
  this_00 = (StreamBlock *)operator_new(0x1018);
  StreamBlock::StreamBlock(this_00);
  this->pFirstBlock = this_00;
  this->pThisBlock = this->pFirstBlock;
  this->ThisPos = 0;
  this->RememberLength = 1;
  this->LengthLeft = 0;
  this->Pos = 0;
  this->SourceEOFFlag = false;
  std::
  map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>_>
  ::map(&this->Markers);
  return;
}

Assistant:

BacktrackingTokenStream<Token>::BacktrackingTokenStream()
    : pSourceStream{nullptr},
      pFirstBlock{new StreamBlock}, // Allocate 1 stream block
      pThisBlock{pFirstBlock},
      ThisPos{0u},
      RememberLength{1u},
      LengthLeft{0u},
      Pos{0u},
      SourceEOFFlag{false} {
}